

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void rcv_thread(int sockfd)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  WINDOW *win;
  size_t __n;
  packet *__buf;
  ulong unaff_RBP;
  char *pcVar4;
  ulong uVar5;
  char *__cp;
  ulong uVar6;
  int iVar7;
  ushort uVar8;
  ulong uVar9;
  id iStack_90;
  id iStack_88;
  thread tStack_80;
  _func_void_int *p_Stack_78;
  sockaddr sStack_70;
  ulong uStack_60;
  mutex *pmStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  code *pcStack_40;
  
  pcStack_40 = (code *)0x102815;
  pckt = (packet *)malloc(0x406);
  while( true ) {
    __buf = pckt;
    pcStack_40 = (code *)0x10283f;
    memset(pckt,0,0x406);
    pcStack_40 = (code *)0x102850;
    sVar3 = recv(sockfd,__buf,0x406,0);
    if ((int)sVar3 + 1U < 2) break;
    unaff_RBP = 0xffffffff;
    iVar7 = -1;
    if (typewin != (WINDOW *)0x0) {
      unaff_RBP = (ulong)(uint)(int)typewin->_cury;
      iVar7 = (int)typewin->_curx;
    }
    pcStack_40 = (code *)0x102894;
    wattr_on(chatwin,((ushort)pckt->color & 0xff) << 8,0);
    pcStack_40 = (code *)0x1028b0;
    wprintw(chatwin,"%s: ",pckt);
    pcStack_40 = (code *)0x1028cf;
    wattr_off(chatwin,((ushort)pckt->color & 0xff) << 8,0);
    pcStack_40 = (code *)0x1028ef;
    wprintw(chatwin,"%s\n",pckt->msg);
    pcStack_40 = (code *)0x1028f7;
    std::mutex::lock(&mutwin);
    pcStack_40 = (code *)0x102903;
    wrefresh(chatwin);
    pcStack_40 = (code *)0x10290f;
    wrefresh(typewin);
    pcStack_40 = (code *)0x102920;
    wmove(typewin,unaff_RBP,iVar7);
    pcStack_40 = (code *)0x102928;
    pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
  }
  pcVar4 = "Erro ao receber mensagem\n";
  pcStack_40 = (code *)0x102940;
  perror("Erro ao receber mensagem\n");
  pcStack_40 = main;
  exit_();
  uStack_48 = 0xffff;
  uStack_50 = 0xffffffffffffffff;
  pmStack_58 = &mutwin;
  iStack_88._M_thread = 0;
  iStack_90._M_thread = 0;
  uVar6 = 0;
  uVar5 = 0;
  uStack_60 = (ulong)(uint)sockfd;
  pcStack_40 = (code *)unaff_RBP;
  if (0 < (int)pcVar4) {
    uVar6 = (ulong)pcVar4 & 0xffffffff;
  }
  do {
    uVar9 = uVar5;
    if (uVar6 == uVar9) {
      uVar1 = 0x15e0;
      goto LAB_001029b4;
    }
    iVar7 = strcmp(*(char **)(__buf->name + uVar9 * 8),"--port");
    uVar5 = uVar9 + 1;
  } while (iVar7 != 0);
  uVar1 = atoi(*(char **)(__buf->name + uVar9 * 8 + 8));
  printf("porta: %d\n",(ulong)(uint)(int)(short)uVar1);
LAB_001029b4:
  uVar8 = (ushort)uVar1;
  initscr();
  cbreak();
  noecho();
  start_color();
  init_colors();
  init_color(0,0,0,0);
  init_pair(0x65,7,0);
  init_pair(0x66,0,7);
  wbkgd(_stdscr,0x6500);
  if (_stdscr == 0) {
    uVar5 = 0xfffffffffffffffa;
    nlines = -1;
    ncolums = -1;
  }
  else {
    nlines = *(short *)(_stdscr + 4) + 1;
    ncolums = *(short *)(_stdscr + 6) + 1;
    uVar5 = (ulong)((int)*(short *)(_stdscr + 4) - 4);
  }
  chatwin = (WINDOW *)newwin(uVar5,ncolums,0,0);
  scrollok(chatwin,1);
  typewin = (WINDOW *)newwin(5,ncolums,nlines + -5,0);
  keypad(typewin,1);
  win = (WINDOW *)newwin(5,0x1c,nlines / 2 + -2,(long)(ncolums + -0x1c) / 2 & 0xffffffff);
  keypad(win,1);
  wbkgd(chatwin,0x6500);
  wbkgd(typewin,0x6500);
  wbkgd(win,0x6500);
  wattr_on(win,0x200000,0);
  wattr_on(chatwin,0x200000,0);
  if (win == (WINDOW *)0x0) {
    iVar7 = -9;
  }
  else {
    iVar7 = (win->_maxx + 1) / 2 + -9;
  }
  box(win,_DAT_00106238,_DAT_0010621c);
  mvwprintw(win,1,iVar7);
  iVar7 = wmove(win,3,2);
  if (iVar7 != -1) {
    whline(win,0x20,0x18);
  }
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  name[0x10] = '\0';
  name[0x11] = '\0';
  name[0x12] = '\0';
  name[0x13] = '\0';
  name[0x14] = '\0';
  name[0x15] = '\0';
  name[0x16] = '\0';
  name[0x17] = '\0';
  input(win,name,0x18,false);
  delwin(win);
  wrefresh(typewin);
  wrefresh(chatwin);
  ::sockfd = socket(2,1,0);
  if (::sockfd != -1) goto LAB_00102be7;
  perror("Erro ao criar socket");
  do {
    while( true ) {
      uVar8 = (ushort)uVar1;
      exit_();
LAB_00102be7:
      sStack_70.sa_family = 2;
      sStack_70.sa_data._0_2_ = uVar8 << 8 | uVar8 >> 8;
      uVar1 = (uint)(ushort)sStack_70.sa_data._0_2_;
      if ((int)pcVar4 < 2) {
        __cp = "187.45.160.148";
      }
      else {
        __cp = *(char **)(__buf->name + 8);
      }
      sStack_70.sa_data._2_4_ = inet_addr(__cp);
      sStack_70.sa_data[6] = '\0';
      sStack_70.sa_data[7] = '\0';
      sStack_70.sa_data[8] = '\0';
      sStack_70.sa_data[9] = '\0';
      sStack_70.sa_data[10] = '\0';
      sStack_70.sa_data[0xb] = '\0';
      sStack_70.sa_data[0xc] = '\0';
      sStack_70.sa_data[0xd] = '\0';
      iVar2 = connect(::sockfd,&sStack_70,0x10);
      iVar7 = ::sockfd;
      if (iVar2 == 0) break;
LAB_00102c74:
      puts("Erro ao conectar!");
    }
    __buf = (packet *)(ulong)(uint)::sockfd;
    uVar1 = 0x1051d0;
    __n = strlen(name);
    sVar3 = send(iVar7,name,__n,0);
    if ((int)sVar3 + 1U < 2) {
      wprintw(chatwin,"Erro ao enviar mensagem");
      exit_();
      goto LAB_00102c74;
    }
    p_Stack_78 = send_thread;
    std::thread::thread<void(*)(int),int&,void>(&tStack_80,&p_Stack_78,&::sockfd);
    if (iStack_88._M_thread != 0) {
LAB_00102d21:
      std::terminate();
    }
    iStack_88 = tStack_80._M_id._M_thread;
    tStack_80._M_id._M_thread = (id)0;
    std::thread::~thread(&tStack_80);
    p_Stack_78 = rcv_thread;
    std::thread::thread<void(*)(int),int&,void>(&tStack_80,&p_Stack_78,&::sockfd);
    if (iStack_90._M_thread != 0) goto LAB_00102d21;
    iStack_90 = tStack_80._M_id._M_thread;
    tStack_80._M_id._M_thread = (id)0;
    std::thread::~thread(&tStack_80);
    std::thread::join();
    std::thread::join();
    close(::sockfd);
  } while( true );
}

Assistant:

void rcv_thread(int sockfd) {
  pckt = (struct packet*)malloc(PACKET_LEN);

  while(1) {
    memset(pckt, 0, PACKET_LEN);

    int mlen = recv(sockfd, pckt, PACKET_LEN, 0);
    if(mlen == -1 || mlen == 0) {
      perror("Erro ao receber mensagem\n");
      exit_();
    }
    int y,x;

    getyx(typewin, y, x);


    wattron(chatwin, COLOR_PAIR(pckt->color));
    wprintw(chatwin, "%s: ", pckt->name);
    wattroff(chatwin, COLOR_PAIR(pckt->color));
    wprintw(chatwin, "%s\n", pckt->msg);

    mutwin.lock();
    wrefresh(chatwin);
    wrefresh(typewin);
    wmove(typewin, y,x);
    mutwin.unlock();
  }
}